

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqliteDeleteColumnNames(sqlite3 *db,Table *pTable)

{
  long in_RSI;
  Column *pCol;
  int i;
  Expr *in_stack_ffffffffffffffd8;
  sqlite3 *db_00;
  int local_14;
  
  db_00 = *(sqlite3 **)(in_RSI + 8);
  if (db_00 != (sqlite3 *)0x0) {
    for (local_14 = 0; local_14 < *(short *)(in_RSI + 0x42); local_14 = local_14 + 1) {
      sqlite3DbFree(db_00,in_stack_ffffffffffffffd8);
      sqlite3ExprDelete(db_00,in_stack_ffffffffffffffd8);
      sqlite3DbFree(db_00,in_stack_ffffffffffffffd8);
      sqlite3DbFree(db_00,in_stack_ffffffffffffffd8);
      sqlite3DbFree(db_00,in_stack_ffffffffffffffd8);
      db_00 = (sqlite3 *)&db_00->lastRowid;
    }
    sqlite3DbFree(db_00,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void sqliteDeleteColumnNames(sqlite3 *db, Table *pTable){
  int i;
  Column *pCol;
  assert( pTable!=0 );
  if( (pCol = pTable->aCol)!=0 ){
    for(i=0; i<pTable->nCol; i++, pCol++){
      sqlite3DbFree(db, pCol->zName);
      sqlite3ExprDelete(db, pCol->pDflt);
      sqlite3DbFree(db, pCol->zDflt);
      sqlite3DbFree(db, pCol->zType);
      sqlite3DbFree(db, pCol->zColl);
    }
    sqlite3DbFree(db, pTable->aCol);
  }
}